

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilksort-seq.c
# Opt level: O0

ELM * binsplit(ELM val,ELM *low,ELM *high)

{
  ELM *pEVar1;
  ELM *mid;
  ELM *high_local;
  ELM *low_local;
  ELM val_local;
  
  mid = high;
  pEVar1 = low;
  while (high_local = pEVar1, high_local != mid) {
    pEVar1 = high_local + (((long)mid - (long)high_local >> 3) + 1 >> 1);
    if (val <= *pEVar1) {
      mid = pEVar1 + -1;
      pEVar1 = high_local;
    }
  }
  if (val < *high_local) {
    val_local = (ELM)(high_local + -1);
  }
  else {
    val_local = (ELM)high_local;
  }
  return (ELM *)val_local;
}

Assistant:

ELM *binsplit(ELM val, ELM *low, ELM *high)
{
    /*
     * returns index which contains greatest element <= val.  If val is
     * less than all elements, returns low-1
     */
    ELM *mid;

    while (low != high) {
        mid = low + ((high - low + 1) >> 1);
        if (val <= *mid)
            high = mid - 1;
        else
            low = mid;
    }

    if (*low > val)
        return low - 1;
    else
        return low;
}